

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsimplifier.h
# Opt level: O1

void __thiscall
soplex::SPxSimplifier<double>::SPxSimplifier(SPxSimplifier<double> *this,SPxSimplifier<double> *old)

{
  TYPE ttype;
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Timer *pTVar5;
  
  this->_vptr_SPxSimplifier = (_func_int **)&PTR__SPxSimplifier_006ab218;
  this->m_name = old->m_name;
  ttype = old->m_timerType;
  iVar2 = old->m_remRows;
  iVar3 = old->m_remCols;
  iVar4 = old->m_remNzos;
  this->m_timerType = old->m_timerType;
  this->m_remRows = iVar2;
  this->m_remCols = iVar3;
  this->m_remNzos = iVar4;
  iVar2 = old->m_chgLRhs;
  iVar3 = old->m_keptBnds;
  iVar4 = old->m_keptLRhs;
  this->m_chgBnds = old->m_chgBnds;
  this->m_chgLRhs = iVar2;
  this->m_keptBnds = iVar3;
  this->m_keptLRhs = iVar4;
  dVar1 = old->m_minReduction;
  this->m_objoffset = old->m_objoffset;
  this->m_minReduction = dVar1;
  this->spxout = old->spxout;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pTVar5 = TimerFactory::createTimer(ttype);
  this->m_timeUsed = pTVar5;
  return;
}

Assistant:

SPxSimplifier(const SPxSimplifier& old)
      : m_name(old.m_name)
      , m_timerType(old.m_timerType)
      , m_remRows(old.m_remRows)
      , m_remCols(old.m_remCols)
      , m_remNzos(old.m_remNzos)
      , m_chgBnds(old.m_chgBnds)
      , m_chgLRhs(old.m_chgLRhs)
      , m_keptBnds(old.m_keptBnds)
      , m_keptLRhs(old.m_keptLRhs)
      , m_objoffset(old.m_objoffset)
      , m_minReduction(old.m_minReduction)
      , spxout(old.spxout)
   {
      m_timeUsed = TimerFactory::createTimer(m_timerType);
      assert(isConsistent());
   }